

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglconvenience.cpp
# Opt level: O2

bool q_hasEglExtension(EGLDisplay display,char *extensionName)

{
  bool bVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_60;
  QArrayDataPointer<QByteArray> local_48;
  char *extensionName_local;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d._0_4_ = 0xaaaaaaaa;
  local_48.d._4_4_ = 0xaaaaaaaa;
  local_48.ptr._0_4_ = 0xaaaaaaaa;
  local_48.ptr._4_4_ = 0xaaaaaaaa;
  extensionName_local = extensionName;
  pcVar2 = (char *)eglQueryString(display,0x3055);
  QByteArray::QByteArray((QByteArray *)&local_60,pcVar2,-1);
  QByteArray::split((char)&local_48);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_60);
  bVar1 = QListSpecialMethodsBase<QByteArray>::contains<char_const*>
                    ((QListSpecialMethodsBase<QByteArray> *)&local_48,&extensionName_local);
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool q_hasEglExtension(EGLDisplay display, const char* extensionName)
{
    QList<QByteArray> extensions =
        QByteArray(reinterpret_cast<const char *>
            (eglQueryString(display, EGL_EXTENSIONS))).split(' ');
    return extensions.contains(extensionName);
}